

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_vfs_write(ma_vfs *pVFS,ma_vfs_file file,void *pSrc,size_t sizeInBytes,
                      size_t *pBytesWritten)

{
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  ma_vfs_callbacks *pCallbacks;
  undefined4 local_4;
  
  if (in_R8 != (undefined8 *)0x0) {
    *in_R8 = 0;
  }
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == 0)) {
    local_4 = MA_INVALID_ARGS;
  }
  else if (*(long *)(in_RDI + 0x20) == 0) {
    local_4 = MA_NOT_IMPLEMENTED;
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x20))(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_vfs_write(ma_vfs* pVFS, ma_vfs_file file, const void* pSrc, size_t sizeInBytes, size_t* pBytesWritten)
{
    ma_vfs_callbacks* pCallbacks = (ma_vfs_callbacks*)pVFS;

    if (pBytesWritten != NULL) {
        *pBytesWritten = 0;
    }

    if (pVFS == NULL || file == NULL || pSrc == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pCallbacks->onWrite == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    return pCallbacks->onWrite(pVFS, file, pSrc, sizeInBytes, pBytesWritten);
}